

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::MethodDescriptorProto::SharedDtor(MethodDescriptorProto *this)

{
  internal::ArenaStringPtr::DestroyNoArena
            (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  internal::ArenaStringPtr::DestroyNoArena
            (&this->input_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  internal::ArenaStringPtr::DestroyNoArena
            (&this->output_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  if ((this != (MethodDescriptorProto *)&_MethodDescriptorProto_default_instance_) &&
     (this->options_ != (MethodOptions *)0x0)) {
    (*(this->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
    return;
  }
  return;
}

Assistant:

void MethodDescriptorProto::SharedDtor() {
  name_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  input_type_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  output_type_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete options_;
  }
}